

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall
slang::ast::Scope::handleNameConflict
          (Scope *this,Symbol *member,Symbol **existing,bool isElaborating)

{
  SymbolKind SVar1;
  SymbolKind SVar2;
  int iVar3;
  int iVar4;
  SymbolIndex SVar5;
  GenericClassDefSymbol *this_00;
  FormalArgumentSymbol *this_01;
  bool bVar6;
  GenerateBlockSymbol *gen2;
  SymbolKind SVar7;
  
  this_00 = (GenericClassDefSymbol *)*existing;
  SVar1 = (this_00->super_Symbol).kind;
  SVar2 = member->kind;
  SVar7 = SVar2 ^ ForwardingTypedef;
  if (SVar1 == TypeAlias && SVar7 == Unknown) {
    TypeAliasType::addForwardDecl((TypeAliasType *)this_00,(ForwardingTypedefSymbol *)member);
    return;
  }
  if (SVar1 == ClassType && SVar7 == Unknown) {
    ClassType::addForwardDecl((ClassType *)this_00,(ForwardingTypedefSymbol *)member);
    return;
  }
  if (SVar1 == GenericClassDef && SVar7 == Unknown) {
    GenericClassDefSymbol::addForwardDecl(this_00,(ForwardingTypedefSymbol *)member);
    return;
  }
  if (SVar1 == ForwardingTypedef) {
    if ((int)SVar2 < 0x25) {
      if (SVar2 == ClassType) {
        ClassType::addForwardDecl((ClassType *)member,(ForwardingTypedefSymbol *)this_00);
        goto LAB_002f7e0c;
      }
      if (SVar2 == TypeAlias) {
        TypeAliasType::addForwardDecl((TypeAliasType *)member,(ForwardingTypedefSymbol *)this_00);
        goto LAB_002f7e0c;
      }
    }
    else {
      if (SVar2 == GenericClassDef) {
        GenericClassDefSymbol::addForwardDecl
                  ((GenericClassDefSymbol *)member,(ForwardingTypedefSymbol *)this_00);
        goto LAB_002f7e0c;
      }
      if (SVar2 == ForwardingTypedef) {
        ForwardingTypedefSymbol::addForwardDecl
                  ((ForwardingTypedefSymbol *)this_00,(ForwardingTypedefSymbol *)member);
        return;
      }
    }
  }
  if (SVar2 == ExplicitImport && SVar1 == ExplicitImport) {
    if (isElaborating) {
      checkImportConflict(this,member,(Symbol *)this_00);
      return;
    }
  }
  else {
    if (SVar2 == GenerateBlock && SVar1 == GenerateBlock) {
      iVar3 = *(int *)((this_00->paramDecls).
                       super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
                       firstElement + 0x18);
      iVar4 = *(int *)&member[1].originatingSyntax;
      if (iVar3 == iVar4) {
        if ((this_00->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>
            .firstElement[0x1c] == '\x01') {
          *existing = member;
        }
        if (iVar3 == iVar4) {
          return;
        }
      }
    }
    this_01 = (FormalArgumentSymbol *)*existing;
    SVar1 = (this_01->super_VariableSymbol).super_ValueSymbol.super_Symbol.kind;
    if ((((SVar1 & ~Root) == Variable) && ((SVar2 & ~Root) == Variable)) && (SVar2 != SVar1)) {
      SVar5 = (this_01->super_VariableSymbol).super_ValueSymbol.super_Symbol.indexInScope;
      if (member->indexInScope < SVar5) {
        SVar5 = member->indexInScope;
      }
      if (SVar1 == FormalArgument) {
        bVar6 = FormalArgumentSymbol::mergeVariable(this_01,(VariableSymbol *)member);
        if (bVar6) {
          (*existing)->indexInScope = SVar5;
          return;
        }
      }
      else {
        bVar6 = FormalArgumentSymbol::mergeVariable
                          ((FormalArgumentSymbol *)member,(VariableSymbol *)this_01);
        if (bVar6) {
          (*existing)->indexInScope = SVar5;
LAB_002f7e0c:
          *existing = member;
          return;
        }
      }
    }
    if (((isElaborating) || (bVar6 = Symbol::isValue(*existing), !bVar6)) ||
       (bVar6 = Symbol::isValue(member), !bVar6)) {
      reportNameConflict(this,member,*existing);
      return;
    }
  }
  Compilation::noteNameConflict(this->compilation,member);
  return;
}

Assistant:

void Scope::handleNameConflict(const Symbol& member, const Symbol*& existing,
                               bool isElaborating) const {
    // We have a name collision; first check if this is ok (forwarding typedefs share a
    // name with the actual typedef) and if not give the user a helpful error message.
    if (existing->kind == SymbolKind::TypeAlias && member.kind == SymbolKind::ForwardingTypedef) {
        // Just add this forwarding typedef to a deferred list so we can process them
        // once we know the kind of symbol the alias points to.
        existing->as<TypeAliasType>().addForwardDecl(member.as<ForwardingTypedefSymbol>());
        return;
    }

    if (existing->kind == SymbolKind::ClassType && member.kind == SymbolKind::ForwardingTypedef) {
        // Class is already defined so nothing to do. When we elaborate the scope we will
        // check that the typedef had the correct 'class' specifier.
        existing->as<ClassType>().addForwardDecl(member.as<ForwardingTypedefSymbol>());
        return;
    }

    if (existing->kind == SymbolKind::GenericClassDef &&
        member.kind == SymbolKind::ForwardingTypedef) {
        // Class is already defined so nothing to do. When we elaborate the scope we will
        // check that the typedef had the correct 'class' specifier.
        existing->as<GenericClassDefSymbol>().addForwardDecl(member.as<ForwardingTypedefSymbol>());
        return;
    }

    if (existing->kind == SymbolKind::ForwardingTypedef) {
        if (member.kind == SymbolKind::ForwardingTypedef) {
            // Found another forwarding typedef; link it to the previous one.
            existing->as<ForwardingTypedefSymbol>().addForwardDecl(
                member.as<ForwardingTypedefSymbol>());
            return;
        }

        if (member.kind == SymbolKind::TypeAlias) {
            // We found the actual type for a previous forwarding declaration. Replace it in
            // the name map.
            member.as<TypeAliasType>().addForwardDecl(existing->as<ForwardingTypedefSymbol>());
            existing = &member;
            return;
        }

        if (member.kind == SymbolKind::ClassType) {
            member.as<ClassType>().addForwardDecl(existing->as<ForwardingTypedefSymbol>());
            existing = &member;
            return;
        }

        if (member.kind == SymbolKind::GenericClassDef) {
            member.as<GenericClassDefSymbol>().addForwardDecl(
                existing->as<ForwardingTypedefSymbol>());
            existing = &member;
            return;
        }
    }

    if (existing->kind == SymbolKind::ExplicitImport && member.kind == SymbolKind::ExplicitImport) {
        if (!isElaborating) {
            // These can't be checked until we can resolve the imports and
            // see if they point to the same symbol.
            compilation.noteNameConflict(member);
        }
        else {
            checkImportConflict(member, *existing);
        }
        return;
    }

    if (existing->kind == SymbolKind::GenerateBlock && member.kind == SymbolKind::GenerateBlock) {
        // If both are generate blocks and both are from the same generate construct, it's ok
        // for them to have the same name. We take the one that is instantiated.
        auto& gen1 = existing->as<GenerateBlockSymbol>();
        auto& gen2 = member.as<GenerateBlockSymbol>();
        if (gen1.constructIndex == gen2.constructIndex) {
            SLANG_ASSERT(gen1.isUninstantiated || gen2.isUninstantiated);
            if (gen1.isUninstantiated)
                existing = &member;
            return;
        }
    }

    // A formal argument (port) and its associated variable declaration get merged into one.
    // This is a pretty gross "feature" but oh well.
    if ((existing->kind == SymbolKind::FormalArgument || existing->kind == SymbolKind::Variable) &&
        (member.kind == SymbolKind::FormalArgument || member.kind == SymbolKind::Variable) &&
        member.kind != existing->kind) {

        // The lookup index should be whichever symbol is earlier.
        uint32_t index = std::min(uint32_t(existing->getIndex()), uint32_t(member.getIndex()));

        if (existing->kind == SymbolKind::FormalArgument) {
            if (const_cast<FormalArgumentSymbol&>(existing->as<FormalArgumentSymbol>())
                    .mergeVariable(member.as<VariableSymbol>())) {
                const_cast<Symbol*>(existing)->setIndex(SymbolIndex(index));
                return;
            }
        }
        else {
            if (const_cast<FormalArgumentSymbol&>(member.as<FormalArgumentSymbol>())
                    .mergeVariable(existing->as<VariableSymbol>())) {
                const_cast<Symbol*>(existing)->setIndex(SymbolIndex(index));
                existing = &member;
                return;
            }
        }
    }

    if (!isElaborating && existing->isValue() && member.isValue()) {
        // We want to look at the symbol types here to provide nicer error messages, but
        // it might not be safe to resolve the type at this point (because we're in the
        // middle of elaborating the scope). Save the member for later reporting.
        compilation.noteNameConflict(member);
        return;
    }

    reportNameConflict(member, *existing);
}